

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Read(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar4;
  uint fSkipStrash;
  uint fGiaSimple;
  char *pcVar5;
  
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar1 = false;
  fGiaSimple = 0;
  fSkipStrash = 0;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"csmvh"), iVar3 == 0x73) {
      fSkipStrash = fSkipStrash ^ 1;
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (iVar3 == 0x6d) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar3 != 99) {
        iVar3 = -2;
        Abc_Print(-2,"usage: &r [-csmvh] <file>\n");
        Abc_Print(-2,"\t         reads the current AIG from the AIGER file\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fGiaSimple == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-c     : toggles reading simple AIG [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fSkipStrash == 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggles structural hashing while reading [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n",
                  pcVar4);
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar4 = "\t<file> : the file name\n";
LAB_002123b0:
        Abc_Print(iVar3,pcVar4);
        return 1;
      }
      fGiaSimple = fGiaSimple ^ 1;
    }
  }
  if (argc - globalUtilOptind == 1) {
    pcVar4 = argv[globalUtilOptind];
    pcVar5 = pcVar4;
    do {
      if (*pcVar5 == '>') {
        *pcVar5 = '\\';
      }
      else if (*pcVar5 == '\0') {
        __stream = fopen(pcVar4,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
          pcVar4 = Extra_FileGetSimilarName(pcVar4,".aig",".blif",".pla",".eqn",".bench");
          if (pcVar4 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
          }
          Abc_Print(1,"\n");
          return 1;
        }
        fclose(__stream);
        if (bVar1) {
          pNew = Gia_ManReadMiniAig(pcVar4);
        }
        else {
          pNew = Gia_AigerRead(pcVar4,fGiaSimple,fSkipStrash,0);
        }
        if (pNew == (Gia_Man_t *)0x0) {
          return 0;
        }
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar5 = pcVar5 + 1;
    } while( true );
  }
  pcVar4 = "There is no file name.\n";
  iVar3 = -1;
  goto LAB_002123b0;
}

Assistant:

int Abc_CommandAbc9Read( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc3_ReadShowHie( char * pFileName, int fFlat );
    Gia_Man_t * pAig = NULL;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    int c, nArgcNew;
    int fUseMini = 0;
    int fVerbose = 0;
    int fGiaSimple = 0;
    int fSkipStrash = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "csmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 's':
            fSkipStrash ^= 1;
            break;
        case 'm':
            fUseMini ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", ".blif", ".pla", ".eqn", ".bench" )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    if ( fUseMini )
        pAig = Gia_ManReadMiniAig( FileName );
//    else if ( Extra_FileIsType( FileName, ".v", NULL, NULL ) )
//        Abc3_ReadShowHie( FileName, fSkipStrash );
    else 
        pAig = Gia_AigerRead( FileName, fGiaSimple, fSkipStrash, 0 );
    if ( pAig )
        Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &r [-csmvh] <file>\n" );
    Abc_Print( -2, "\t         reads the current AIG from the AIGER file\n" );
    Abc_Print( -2, "\t-c     : toggles reading simple AIG [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles structural hashing while reading [default = %s]\n", !fSkipStrash? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n", fUseMini? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}